

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O3

void __thiscall cppnet::PoolAlloter::~PoolAlloter(PoolAlloter *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppMVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  void *data;
  char *local_20;
  
  (this->super_Alloter)._vptr_Alloter = (_func_int **)&PTR__PoolAlloter_00123720;
  ppcVar4 = (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar3 = (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar4 != ppcVar3) {
    do {
      if (*ppcVar4 != (char *)0x0) {
        peVar1 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_20 = *ppcVar4;
        (*peVar1->_vptr_Alloter[5])(peVar1,&local_20,0);
        ppcVar3 = (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      ppcVar4 = ppcVar4 + 1;
    } while (ppcVar4 != ppcVar3);
  }
  this_00 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ppcVar4 = (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar4 != (pointer)0x0) {
    operator_delete(ppcVar4);
  }
  ppMVar2 = (this->_free_list).
            super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar2 != (pointer)0x0) {
    operator_delete(ppMVar2);
  }
  return;
}

Assistant:

PoolAlloter::~PoolAlloter() {
    for (auto iter = _malloc_vec.begin(); iter != _malloc_vec.end(); ++iter) {
        if (*iter) {
            void* data = (void*)*iter;
            _alloter->Free(data);
        }
    }
}